

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultNamerDisposer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::DefaultNamerDisposer::DefaultNamerDisposer
          (DefaultNamerDisposer *this,NamerCreator *namerCreator)

{
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *in_RDI;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *__x;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *in_stack_ffffffffffffff80;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *this_00;
  undefined8 in_stack_ffffffffffffffa0;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> local_30;
  
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::function
            (in_stack_ffffffffffffff80);
  DefaultNamerFactory::getDefaultNamer();
  __x = &local_30;
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::operator=
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)in_stack_ffffffffffffffa0
             ,in_RDI);
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::~function
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)0x2033fb);
  this_00 = (function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)&stack0xffffffffffffffa0;
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::function(this_00,__x);
  DefaultNamerFactory::setDefaultNamer(this_00);
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::~function
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)0x203425);
  return;
}

Assistant:

DefaultNamerDisposer::DefaultNamerDisposer(NamerCreator namerCreator)
    {
        previous_result = DefaultNamerFactory::getDefaultNamer();
        DefaultNamerFactory::setDefaultNamer(std::move(namerCreator));
    }